

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_prune_ab_partitions
               (AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,int pb_source_variance,
               int64_t best_rdcost,RD_RECT_PART_WIN_INFO *rect_part_win_info,
               _Bool ext_partition_allowed,PartitionSearchState *part_state,
               int *ab_partitions_allowed)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  int in_ECX;
  PC_TREE *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  RD_RECT_PART_WIN_INFO *in_R9;
  byte in_stack_00000008;
  long in_stack_00000010;
  uint *in_stack_00000018;
  int64_t vert_b_rd;
  int64_t vert_a_rd;
  int64_t horz_b_rd;
  int64_t horz_a_rd;
  int vertab_partition_allowed;
  int horzab_partition_allowed;
  PartitionCfg *part_cfg;
  int64_t *split_rd;
  int64_t *vert_rd;
  int64_t *horz_rd;
  undefined7 in_stack_000000b0;
  int in_stack_000000c8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 local_98;
  long local_90;
  bool local_86;
  bool local_85;
  bool local_84;
  bool local_83;
  bool local_82;
  bool local_81;
  uint local_60;
  uint local_5c;
  
  bVar1 = in_stack_00000008 & 1;
  plVar3 = (long *)(in_stack_00000010 + 0xe8);
  plVar4 = (long *)(in_stack_00000010 + 0xf8);
  plVar5 = (long *)(in_stack_00000010 + 200);
  local_81 = false;
  if ((bVar1 != 0) && (local_81 = false, (*(byte *)(in_RDI + 0x426ff) & 1) != 0)) {
    local_81 = *(int *)(in_stack_00000010 + 0x120) != 0;
  }
  local_82 = false;
  if ((bVar1 != 0) && (local_82 = false, (*(byte *)(in_RDI + 0x426ff) & 1) != 0)) {
    local_82 = *(int *)(in_stack_00000010 + 0x124) != 0;
  }
  if (*(int *)(in_RDI + 0x60954) != 0) {
    if (*(int *)(in_RDI + 0x60954) == 1) {
      local_83 = true;
      if ((in_RDX->partitioning != '\x01') &&
         ((in_RDX->partitioning != '\0' || (local_83 = true, 0x1f < in_ECX)))) {
        local_83 = in_RDX->partitioning == '\x03';
      }
      local_84 = true;
      local_86 = local_84;
      local_85 = local_83;
      if ((in_RDX->partitioning != '\x02') &&
         ((in_RDX->partitioning != '\0' || (local_84 = true, local_86 = local_84, 0x1f < in_ECX))))
      {
        local_86 = in_RDX->partitioning == '\x03';
      }
    }
    else {
      local_85 = true;
      if (in_RDX->partitioning != '\x01') {
        local_85 = in_RDX->partitioning == '\x03';
      }
      local_86 = true;
      if (in_RDX->partitioning != '\x02') {
        local_86 = in_RDX->partitioning == '\x03';
      }
    }
    local_81 = (bool)(local_85 & local_81);
    local_82 = (bool)(local_86 & local_82);
    if (*plVar3 < 0x7fffffffffffffff) {
      local_90 = *plVar3;
    }
    else {
      local_90 = 0;
    }
    *plVar3 = local_90;
    if (*(long *)(in_stack_00000010 + 0xf0) < 0x7fffffffffffffff) {
      local_98 = *(undefined8 *)(in_stack_00000010 + 0xf0);
    }
    else {
      local_98 = 0;
    }
    *(undefined8 *)(in_stack_00000010 + 0xf0) = local_98;
    if (*plVar4 < 0x7fffffffffffffff) {
      local_a0 = *plVar4;
    }
    else {
      local_a0 = 0;
    }
    *plVar4 = local_a0;
    if (*(long *)(in_stack_00000010 + 0x100) < 0x7fffffffffffffff) {
      local_a8 = *(undefined8 *)(in_stack_00000010 + 0x100);
    }
    else {
      local_a8 = 0;
    }
    *(undefined8 *)(in_stack_00000010 + 0x100) = local_a8;
    if (*plVar5 < 0x7fffffffffffffff) {
      local_b0 = *plVar5;
    }
    else {
      local_b0 = 0;
    }
    *plVar5 = local_b0;
    if (*(long *)(in_stack_00000010 + 0xd0) < 0x7fffffffffffffff) {
      local_b8 = *(undefined8 *)(in_stack_00000010 + 0xd0);
    }
    else {
      local_b8 = 0;
    }
    *(undefined8 *)(in_stack_00000010 + 0xd0) = local_b8;
    if (*(long *)(in_stack_00000010 + 0xd8) < 0x7fffffffffffffff) {
      local_c0 = *(undefined8 *)(in_stack_00000010 + 0xd8);
    }
    else {
      local_c0 = 0;
    }
    *(undefined8 *)(in_stack_00000010 + 0xd8) = local_c0;
    if (*(long *)(in_stack_00000010 + 0xe0) < 0x7fffffffffffffff) {
      local_c8 = *(undefined8 *)(in_stack_00000010 + 0xe0);
    }
    else {
      local_c8 = 0;
    }
    *(undefined8 *)(in_stack_00000010 + 0xe0) = local_c8;
  }
  local_5c = (uint)local_81;
  local_60 = (uint)local_82;
  *in_stack_00000018 = local_5c;
  in_stack_00000018[1] = local_5c;
  if (*(int *)(in_RDI + 0x60954) != 0) {
    lVar6 = *(long *)(in_stack_00000010 + 0xf0) + *plVar5 + *(long *)(in_stack_00000010 + 0xd0);
    lVar7 = *plVar3 + *(long *)(in_stack_00000010 + 0xd8) + *(long *)(in_stack_00000010 + 0xe0);
    if (*(int *)(in_RDI + 0x60954) == 1) {
      *in_stack_00000018 = (uint)((lVar6 / 0x10) * 0xe < in_R8) & *in_stack_00000018;
      in_stack_00000018[1] = (uint)((lVar7 / 0x10) * 0xe < in_R8) & in_stack_00000018[1];
    }
    else {
      *in_stack_00000018 = (uint)((lVar6 / 0x10) * 0xf < in_R8) & *in_stack_00000018;
      in_stack_00000018[1] = (uint)((lVar7 / 0x10) * 0xf < in_R8) & in_stack_00000018[1];
    }
  }
  in_stack_00000018[2] = local_60;
  in_stack_00000018[3] = local_60;
  if (*(int *)(in_RDI + 0x60954) != 0) {
    lVar6 = *(long *)(in_stack_00000010 + 0x100) + *plVar5 + *(long *)(in_stack_00000010 + 0xd8);
    lVar7 = *plVar4 + *(long *)(in_stack_00000010 + 0xd0) + *(long *)(in_stack_00000010 + 0xe0);
    if (*(int *)(in_RDI + 0x60954) == 1) {
      in_stack_00000018[2] = (uint)((lVar6 / 0x10) * 0xe < in_R8) & in_stack_00000018[2];
      in_stack_00000018[3] = (uint)((lVar7 / 0x10) * 0xe < in_R8) & in_stack_00000018[3];
    }
    else {
      in_stack_00000018[2] = (uint)((lVar6 / 0x10) * 0xf < in_R8) & in_stack_00000018[2];
      in_stack_00000018[3] = (uint)((lVar7 / 0x10) * 0xf < in_R8) & in_stack_00000018[3];
    }
  }
  if ((((*(int *)(in_RDI + 0x6095c) != 0) && (bVar1 != 0)) &&
      (*(int *)(in_stack_00000010 + 0x120) != 0)) && (*(int *)(in_stack_00000010 + 0x124) != 0)) {
    get_unsigned_bits(0);
    ml_prune_ab_partition
              ((AV1_COMP *)pc_tree,pb_source_variance,in_stack_000000c8,best_rdcost,
               (PartitionSearchState *)rect_part_win_info,
               (int *)CONCAT17(ext_partition_allowed,in_stack_000000b0));
  }
  if ((1 < *(int *)(in_RDI + 0x609b8)) && (*in_stack_00000018 != 0)) {
    uVar2 = evaluate_ab_partition_based_on_split(in_RDX,'\x01',in_R9,*(int *)(in_RSI + 0x4208),0,1);
    *in_stack_00000018 = uVar2 & *in_stack_00000018;
  }
  if ((1 < *(int *)(in_RDI + 0x609b8)) && (in_stack_00000018[1] != 0)) {
    uVar2 = evaluate_ab_partition_based_on_split(in_RDX,'\x01',in_R9,*(int *)(in_RSI + 0x4208),2,3);
    in_stack_00000018[1] = uVar2 & in_stack_00000018[1];
  }
  if ((1 < *(int *)(in_RDI + 0x609b8)) && (in_stack_00000018[2] != 0)) {
    uVar2 = evaluate_ab_partition_based_on_split(in_RDX,'\x02',in_R9,*(int *)(in_RSI + 0x4208),0,2);
    in_stack_00000018[2] = uVar2 & in_stack_00000018[2];
  }
  if ((1 < *(int *)(in_RDI + 0x609b8)) && (in_stack_00000018[3] != 0)) {
    uVar2 = evaluate_ab_partition_based_on_split(in_RDX,'\x02',in_R9,*(int *)(in_RSI + 0x4208),1,3);
    in_stack_00000018[3] = uVar2 & in_stack_00000018[3];
  }
  return;
}

Assistant:

void av1_prune_ab_partitions(AV1_COMP *cpi, const MACROBLOCK *x,
                             const PC_TREE *pc_tree, int pb_source_variance,
                             int64_t best_rdcost,
                             const RD_RECT_PART_WIN_INFO *rect_part_win_info,
                             bool ext_partition_allowed,
                             PartitionSearchState *part_state,
                             int *ab_partitions_allowed) {
  int64_t *horz_rd = part_state->rect_part_rd[HORZ];
  int64_t *vert_rd = part_state->rect_part_rd[VERT];
  int64_t *split_rd = part_state->split_rd;
  const PartitionCfg *const part_cfg = &cpi->oxcf.part_cfg;
  // The standard AB partitions are allowed initially if ext-partition-types are
  // allowed.
  int horzab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[HORZ];
  int vertab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[VERT];

  // Pruning: pruning out AB partitions on one main direction based on the
  // current best partition and source variance.
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    if (cpi->sf.part_sf.prune_ext_partition_types_search_level == 1) {
      // TODO(debargha,huisu@google.com): may need to tune the threshold for
      // pb_source_variance.
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    } else {
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    }
    horz_rd[0] = (horz_rd[0] < INT64_MAX ? horz_rd[0] : 0);
    horz_rd[1] = (horz_rd[1] < INT64_MAX ? horz_rd[1] : 0);
    vert_rd[0] = (vert_rd[0] < INT64_MAX ? vert_rd[0] : 0);
    vert_rd[1] = (vert_rd[1] < INT64_MAX ? vert_rd[1] : 0);
    split_rd[0] = (split_rd[0] < INT64_MAX ? split_rd[0] : 0);
    split_rd[1] = (split_rd[1] < INT64_MAX ? split_rd[1] : 0);
    split_rd[2] = (split_rd[2] < INT64_MAX ? split_rd[2] : 0);
    split_rd[3] = (split_rd[3] < INT64_MAX ? split_rd[3] : 0);
  }

  // Pruning: pruning out horz_a or horz_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[HORZ_A] = horzab_partition_allowed;
  ab_partitions_allowed[HORZ_B] = horzab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t horz_a_rd = horz_rd[1] + split_rd[0] + split_rd[1];
    const int64_t horz_b_rd = horz_rd[0] + split_rd[2] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out vert_a or vert_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[VERT_A] = vertab_partition_allowed;
  ab_partitions_allowed[VERT_B] = vertab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t vert_a_rd = vert_rd[1] + split_rd[0] + split_rd[2];
    const int64_t vert_b_rd = vert_rd[0] + split_rd[1] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out some ab partitions using a DNN taking rd costs of
  // sub-blocks from previous basic partition types.
  if (cpi->sf.part_sf.ml_prune_partition && ext_partition_allowed &&
      part_state->partition_rect_allowed[HORZ] &&
      part_state->partition_rect_allowed[VERT]) {
    // TODO(huisu@google.com): x->source_variance may not be the current
    // block's variance. The correct one to use is pb_source_variance. Need to
    // re-train the model to fix it.
    ml_prune_ab_partition(cpi, pc_tree->partitioning,
                          get_unsigned_bits(x->source_variance), best_rdcost,
                          part_state, ab_partitions_allowed);
  }

  // Pruning: pruning AB partitions based on the number of horz/vert wins
  // in the current block and sub-blocks in PARTITION_SPLIT.
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_A]) {
    ab_partitions_allowed[HORZ_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 0, 1);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_B]) {
    ab_partitions_allowed[HORZ_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 2, 3);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_A]) {
    ab_partitions_allowed[VERT_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 0, 2);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_B]) {
    ab_partitions_allowed[VERT_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 1, 3);
  }
}